

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O2

uint Cut_TruthPhase(Csw_Cut_t *pCut,Csw_Cut_t *pCut1)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  bVar3 = pCut->nFanins;
  uVar5 = 0;
  if ((char)bVar3 < '\x01') {
    bVar3 = 0;
  }
  uVar4 = 0;
  iVar6 = 0;
  while ((bVar3 != uVar5 && (iVar6 != pCut1->nFanins))) {
    iVar1 = *(int *)((long)&pCut1[1].pNext + (long)iVar6 * 4);
    iVar2 = *(int *)((long)&pCut[1].pNext + uVar5 * 4);
    if (iVar1 <= iVar2) {
      if (iVar2 != iVar1) {
        __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswCut.c"
                      ,0x83,"unsigned int Cut_TruthPhase(Csw_Cut_t *, Csw_Cut_t *)");
      }
      uVar4 = uVar4 | 1 << ((uint)uVar5 & 0x1f);
      iVar6 = iVar6 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  return uVar4;
}

Assistant:

static inline unsigned Cut_TruthPhase( Cut_Cut_t * pCut, Cut_Cut_t * pCut1 )
{
    unsigned uPhase = 0;
    int i, k;
    for ( i = k = 0; i < (int)pCut->nLeaves; i++ )
    {
        if ( k == (int)pCut1->nLeaves )
            break;
        if ( pCut->pLeaves[i] < pCut1->pLeaves[k] )
            continue;
        assert( pCut->pLeaves[i] == pCut1->pLeaves[k] );
        uPhase |= (1 << i);
        k++;
    }
    return uPhase;
}